

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXingOpenCV.h
# Opt level: O0

void DrawBarcode(Mat *img,Barcode *barcode)

{
  PointI p;
  PointI p_00;
  PointI p_01;
  PointI p_02;
  PointI p_03;
  initializer_list<cv::Point_<int>_> __l;
  Point_<int> *pPVar1;
  reference pvVar2;
  size_type sVar3;
  Result *in_RSI;
  int npts;
  Point_<int> *pts;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> contour;
  anon_class_1_0_00000001 zx2cv;
  Position pos;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffe1c;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffe24;
  int in_stack_fffffffffffffe28;
  int iVar6;
  int in_stack_fffffffffffffe2c;
  Result *this;
  allocator_type *__a;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *this_00;
  iterator pPVar7;
  pointer *ppPVar8;
  undefined1 local_180 [32];
  Point_<int> local_160;
  value_type local_158;
  undefined1 local_148 [8];
  string local_140 [32];
  undefined1 local_120 [24];
  Scalar_ local_108 [32];
  _InputOutputArray local_e8;
  int local_cc;
  Point_<int> *local_c8 [4];
  value_type local_a8;
  value_type local_a0;
  value_type local_98;
  value_type local_90;
  Point_<int> local_88;
  allocator_type local_80 [8];
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> local_78;
  undefined8 local_60;
  Point_<int> local_58 [4];
  Point_<int> local_38;
  PointT<int> PStack_30;
  PointT<int> local_28;
  PointT<int> PStack_20;
  
  this = in_RSI;
  pPVar1 = (Point_<int> *)ZXing::Result::position(in_RSI);
  local_38 = *pPVar1;
  PStack_30 = *(PointT<int> *)(pPVar1 + 1);
  local_28 = *(PointT<int> *)(pPVar1 + 2);
  PStack_20 = *(PointT<int> *)(pPVar1 + 3);
  pPVar7 = &local_38;
  pvVar2 = std::array<ZXing::PointT<int>,_4UL>::operator[]
                     ((array<ZXing::PointT<int>,_4UL> *)
                      CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                      CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  local_90 = *pvVar2;
  p.y = in_stack_fffffffffffffe2c;
  p.x = in_stack_fffffffffffffe28;
  DrawBarcode::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)
             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),p);
  __a = local_80;
  pvVar2 = std::array<ZXing::PointT<int>,_4UL>::operator[]
                     ((array<ZXing::PointT<int>,_4UL> *)
                      CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                      CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  local_98 = *pvVar2;
  p_00.y = in_stack_fffffffffffffe2c;
  p_00.x = in_stack_fffffffffffffe28;
  DrawBarcode::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)
             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),p_00);
  this_00 = &local_78;
  pvVar2 = std::array<ZXing::PointT<int>,_4UL>::operator[]
                     ((array<ZXing::PointT<int>,_4UL> *)
                      CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                      CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  local_a0 = *pvVar2;
  p_01.y = in_stack_fffffffffffffe2c;
  p_01.x = in_stack_fffffffffffffe28;
  DrawBarcode::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)
             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),p_01);
  ppPVar8 = &local_78.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl
             .super__Vector_impl_data._M_finish;
  pvVar2 = std::array<ZXing::PointT<int>,_4UL>::operator[]
                     ((array<ZXing::PointT<int>,_4UL> *)
                      CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                      CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  local_a8 = *pvVar2;
  p_02.y = in_stack_fffffffffffffe2c;
  p_02.x = in_stack_fffffffffffffe28;
  DrawBarcode::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)
             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),p_02);
  local_60 = 4;
  local_78.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = &local_88;
  std::allocator<cv::Point_<int>_>::allocator((allocator<cv::Point_<int>_> *)0x106cd2);
  __l._M_len = (size_type)ppPVar8;
  __l._M_array = pPVar7;
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector(this_00,__l,__a);
  std::allocator<cv::Point_<int>_>::~allocator((allocator<cv::Point_<int>_> *)0x106d03);
  pPVar1 = local_58;
  local_c8[0] = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::data
                          ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)0x106d15);
  sVar3 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size
                    ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)pPVar1);
  local_cc = (int)sVar3;
  cv::_InputOutputArray::_InputOutputArray
            ((_InputOutputArray *)pPVar1,
             (Mat *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  cv::Scalar_<double>::Scalar_
            ((Scalar_<double> *)this,(double)in_RSI,(double)pPVar1,
             (double)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
             (double)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  iVar6 = 0;
  uVar5 = 8;
  uVar4 = 1;
  cv::polylines(&local_e8,(Point_ **)local_c8,&local_cc,1,true,local_108,1,8,0);
  cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x106db9);
  cv::_InputOutputArray::_InputOutputArray
            ((_InputOutputArray *)pPVar1,(Mat *)CONCAT44(in_stack_fffffffffffffe2c,iVar6));
  ZXing::Result::text_abi_cxx11_();
  pvVar2 = std::array<ZXing::PointT<int>,_4UL>::operator[]
                     ((array<ZXing::PointT<int>,_4UL> *)CONCAT44(in_stack_fffffffffffffe24,uVar5),
                      CONCAT44(in_stack_fffffffffffffe1c,uVar4));
  local_158 = *pvVar2;
  p_03.y = in_stack_fffffffffffffe2c;
  p_03.x = iVar6;
  DrawBarcode::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)CONCAT44(in_stack_fffffffffffffe24,uVar5),p_03);
  cv::Point_<int>::Point_(&local_160,0,0x14);
  cv::operator+((Point_<int> *)in_RSI,pPVar1);
  cv::Scalar_<double>::Scalar_
            ((Scalar_<double> *)this,(double)in_RSI,(double)pPVar1,
             (double)CONCAT44(in_stack_fffffffffffffe2c,iVar6),
             (double)CONCAT44(in_stack_fffffffffffffe24,uVar5));
  cv::putText(0,local_120,local_140,local_148,2,local_180,1,8,0);
  std::__cxx11::string::~string(local_140);
  cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x106ed3);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~vector
            ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)pPVar1);
  return;
}

Assistant:

inline void DrawBarcode(cv::Mat& img, ZXing::Barcode barcode)
{
	auto pos = barcode.position();
	auto zx2cv = [](ZXing::PointI p) { return cv::Point(p.x, p.y); };
	auto contour = std::vector<cv::Point>{zx2cv(pos[0]), zx2cv(pos[1]), zx2cv(pos[2]), zx2cv(pos[3])};
	const auto* pts = contour.data();
	int npts = contour.size();

	cv::polylines(img, &pts, &npts, 1, true, CV_RGB(0, 255, 0));
	cv::putText(img, barcode.text(), zx2cv(pos[3]) + cv::Point(0, 20), cv::FONT_HERSHEY_DUPLEX, 0.5, CV_RGB(0, 255, 0));
}